

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

void compute_best_interintra_mode
               (AV1_COMP *cpi,MB_MODE_INFO *mbmi,MACROBLOCKD *xd,MACROBLOCK *x,
               int *interintra_mode_cost,BUFFER_SET *orig_dst,uint8_t *intrapred,uint8_t *tmp_buf,
               INTERINTRA_MODE *best_interintra_mode,int64_t *best_interintra_rd,
               INTERINTRA_MODE interintra_mode,BLOCK_SIZE bsize)

{
  int iVar1;
  long lVar2;
  uint8_t *in_RCX;
  BUFFER_SET *in_RDX;
  MACROBLOCK *unaff_RBX;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  long in_R8;
  MACROBLOCKD *in_R9;
  undefined8 unaff_R14;
  AV1_COMP *unaff_retaddr;
  int *in_stack_00000010;
  int64_t *in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  byte in_stack_00000028;
  undefined7 in_stack_00000029;
  undefined1 in_stack_00000030;
  undefined7 in_stack_00000031;
  int64_t rd;
  int rmode;
  int bw;
  int64_t skip_sse_sb;
  int64_t dist;
  uint8_t skip_txfm_sb;
  int rate;
  AV1_COMMON *cm;
  uint8_t *in_stack_ffffffffffffffa0;
  undefined4 local_58;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  qm_val_t **ppqVar3;
  BLOCK_SIZE bsize_00;
  
  bsize_00 = (BLOCK_SIZE)((ulong)unaff_R14 >> 0x38);
  ppqVar3 = in_RDI[0x10].plane[1].seg_qmatrix[4] + 0xe;
  *(byte *)(in_RSI + 0x40) = in_stack_00000028;
  iVar1 = *(int *)(in_R8 + (ulong)in_stack_00000028 * 4);
  av1_build_intra_predictors_for_interintra
            ((AV1_COMMON *)unaff_RBX,in_RDI,(BLOCK_SIZE)((ulong)in_RSI >> 0x38),(int)in_RSI,in_RDX,
             in_RCX,in_stack_00000020);
  av1_combine_interintra
            (in_R9,(BLOCK_SIZE)((ulong)ppqVar3 >> 0x38),(int)ppqVar3,
             (uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,(int)unaff_RBX);
  model_rd_for_sb_with_curvfit
            (unaff_retaddr,bsize_00,unaff_RBX,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
             in_stack_00000010,in_stack_00000018,
             (uint8_t *)CONCAT44(in_stack_00000024,in_stack_00000020),
             (int64_t *)CONCAT71(in_stack_00000029,in_stack_00000028),
             (int *)CONCAT71(in_stack_00000031,in_stack_00000030),(int64_t *)rd,_rmode);
  lVar2 = ((long)(in_stack_ffffffffffffffb4 + iVar1) * (long)*(int *)(in_RCX + 0x4218) + 0x100 >> 9)
          + CONCAT44(in_stack_ffffffffffffffac,local_58) * 0x80;
  if (lVar2 < *(long *)CONCAT44(in_stack_00000024,in_stack_00000020)) {
    *(long *)CONCAT44(in_stack_00000024,in_stack_00000020) = lVar2;
    *(undefined1 *)in_stack_00000018 = *(undefined1 *)(in_RSI + 0x40);
  }
  return;
}

Assistant:

static inline void compute_best_interintra_mode(
    const AV1_COMP *const cpi, MB_MODE_INFO *mbmi, MACROBLOCKD *xd,
    MACROBLOCK *const x, const int *const interintra_mode_cost,
    const BUFFER_SET *orig_dst, uint8_t *intrapred, const uint8_t *tmp_buf,
    INTERINTRA_MODE *best_interintra_mode, int64_t *best_interintra_rd,
    INTERINTRA_MODE interintra_mode, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  int rate;
  uint8_t skip_txfm_sb;
  int64_t dist, skip_sse_sb;
  const int bw = block_size_wide[bsize];
  mbmi->interintra_mode = interintra_mode;
  int rmode = interintra_mode_cost[interintra_mode];
  av1_build_intra_predictors_for_interintra(cm, xd, bsize, 0, orig_dst,
                                            intrapred, bw);
  av1_combine_interintra(xd, bsize, 0, tmp_buf, bw, intrapred, bw);
  model_rd_sb_fn[MODELRD_TYPE_INTERINTRA](cpi, bsize, x, xd, 0, 0, &rate, &dist,
                                          &skip_txfm_sb, &skip_sse_sb, NULL,
                                          NULL, NULL);
  int64_t rd = RDCOST(x->rdmult, rate + rmode, dist);
  if (rd < *best_interintra_rd) {
    *best_interintra_rd = rd;
    *best_interintra_mode = mbmi->interintra_mode;
  }
}